

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O1

C_matrix<double> * __thiscall
C_matrix<double>::operator*
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,double *x)

{
  double dVar1;
  double dVar2;
  unsigned_short l;
  int iVar3;
  double *pdVar4;
  uint uVar5;
  unsigned_short c;
  uint uVar6;
  
  C_matrix(__return_storage_ptr__,this->m_L,this->m_C);
  if (0 < this->m_L) {
    uVar6 = 0;
    l = 0;
    do {
      iVar3 = this->m_C;
      if (0 < iVar3) {
        uVar5 = 0;
        c = 0;
        do {
          dVar1 = this->m_A[(int)(iVar3 * uVar6 + uVar5)];
          dVar2 = *x;
          pdVar4 = operator()(__return_storage_ptr__,l,c);
          *pdVar4 = dVar1 * dVar2;
          c = c + 1;
          uVar5 = (uint)c;
          iVar3 = this->m_C;
        } while ((int)uVar5 < iVar3);
      }
      l = l + 1;
      uVar6 = (uint)l;
    } while ((int)uVar6 < this->m_L);
  }
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator* (const dataType& x)
{
    C_matrix B(m_L,m_C);
    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            B(i,j) = m_A[getIndex(i,j)]*x;
        }
    }
    return B;
}